

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-rope.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  int i_2;
  int n_elements;
  float *r2_data;
  float *r1_data;
  double diff;
  double sum1;
  double sum0;
  ggml_cgraph *gf;
  int j;
  int i_1;
  int sections [4];
  ggml_tensor *p2_1;
  ggml_tensor *p1_1;
  ggml_tensor *p0_1;
  int i;
  ggml_tensor *p2;
  ggml_tensor *p1;
  ggml_tensor *p0;
  int mode;
  ggml_tensor *r2;
  ggml_tensor *r1;
  ggml_tensor *r0;
  int n_past_2;
  int n_past_0;
  int64_t ne [4];
  int64_t n_rot;
  int ndims;
  int m;
  ggml_tensor *x;
  ggml_context *ctx0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> work_buffer;
  ggml_init_params params;
  undefined4 uVar5;
  undefined8 uVar4;
  undefined4 uVar7;
  undefined8 uVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe10;
  long in_stack_fffffffffffffe20;
  ggml_cgraph *in_stack_fffffffffffffe28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe30;
  long in_stack_fffffffffffffe38;
  ggml_context *in_stack_fffffffffffffe40;
  uint local_194;
  int local_168;
  double local_150;
  double local_148;
  double local_140;
  int local_130;
  int local_12c;
  undefined8 local_128;
  undefined8 local_120;
  long local_118;
  ggml_context *local_110;
  long local_108;
  int local_fc;
  long local_f8;
  long local_f0;
  long local_e8;
  uint local_dc;
  long local_d8;
  ggml_cgraph *local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_c8;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  long local_a8;
  undefined8 uStack_a0;
  undefined8 local_90;
  undefined4 local_88;
  int local_84;
  ggml_tensor *local_80;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  int local_4;
  
  local_4 = 0;
  local_18 = 0;
  local_28 = 0x8000000;
  uStack_20 = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10235c);
  local_58 = local_18;
  local_68 = local_28;
  uStack_60 = uStack_20;
  uVar4 = local_28;
  uVar6 = uStack_20;
  local_48 = ggml_init();
  for (local_84 = 0; local_84 < 5; local_84 = local_84 + 1) {
    local_88 = 4;
    local_90 = 0x80;
    local_a8 = 0x49;
    uStack_a0 = 1;
    local_b8 = 0x100;
    uStack_b0 = 0x20;
    local_bc = 100;
    local_c0 = 0x21;
    local_80 = get_random_tensor_f32
                         (in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                          (int64_t *)in_stack_fffffffffffffe30,
                          (float)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                          SUB84(in_stack_fffffffffffffe28,0));
    uVar7 = (undefined4)((ulong)uVar6 >> 0x20);
    uVar5 = (undefined4)((ulong)uVar4 >> 0x20);
    local_dc = 0xffffffff;
    if (local_84 < 3) {
      local_e8 = ggml_new_tensor_1d(local_48,0x1a,local_a8);
      local_f0 = ggml_new_tensor_1d(local_48,0x1a,local_a8);
      local_f8 = ggml_new_tensor_1d(local_48,0x1a,local_a8);
      for (local_fc = 0; local_fc < local_a8; local_fc = local_fc + 1) {
        *(int *)(*(long *)(local_e8 + 0xf8) + (long)local_fc * 4) = local_fc + 100;
        *(undefined4 *)(*(long *)(local_f0 + 0xf8) + (long)local_fc * 4) = 0xffffffbd;
        *(int *)(*(long *)(local_f8 + 0xf8) + (long)local_fc * 4) = local_fc + 0x21;
      }
      if (local_84 == 0) {
        local_194 = 0;
      }
      else {
        local_194 = 4;
        if (local_84 == 1) {
          local_194 = 2;
        }
      }
      local_dc = local_194;
      local_c8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ggml_rope(local_48,local_80,local_e8,0x80,local_194);
      local_d0 = (ggml_cgraph *)ggml_rope(local_48,local_c8,local_f0,0x80,local_dc);
      local_d8 = ggml_rope(local_48,local_80,local_f8,0x80,local_dc);
    }
    else {
      local_108 = ggml_new_tensor_1d(local_48,0x1a,local_a8 << 2);
      in_stack_fffffffffffffe40 = (ggml_context *)ggml_new_tensor_1d(local_48,0x1a,local_a8 << 2);
      local_110 = in_stack_fffffffffffffe40;
      in_stack_fffffffffffffe38 = ggml_new_tensor_1d(local_48,0x1a,local_a8 << 2);
      local_128 = 0x1800000010;
      local_120 = 0x18;
      local_dc = 0x18;
      if (local_84 == 3) {
        local_dc = 8;
      }
      for (local_12c = 0; local_12c < local_a8; local_12c = local_12c + 1) {
        for (local_130 = 0; local_130 < 4; local_130 = local_130 + 1) {
          *(int *)(*(long *)(local_108 + 0xf8) + ((long)local_12c + local_a8 * local_130) * 4) =
               local_12c + 100 + local_130;
          *(undefined4 *)
           (*(long *)(local_110 + 0xf8) + ((long)local_12c + local_a8 * local_130) * 4) = 0xffffffbd
          ;
          *(int *)(*(long *)(in_stack_fffffffffffffe38 + 0xf8) +
                  ((long)local_12c + local_a8 * local_130) * 4) = local_12c + 0x21 + local_130;
        }
      }
      uVar4 = CONCAT44(uVar5,local_dc);
      uVar6 = CONCAT44(uVar7,0x8000);
      local_118 = in_stack_fffffffffffffe38;
      in_stack_fffffffffffffe30 =
           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           ggml_rope_multi(local_48,local_80,local_108,0,0x80,&local_128,uVar4,uVar6);
      uVar4 = CONCAT44((int)((ulong)uVar4 >> 0x20),local_dc);
      uVar6 = CONCAT44((int)((ulong)uVar6 >> 0x20),0x8000);
      local_c8 = in_stack_fffffffffffffe30;
      in_stack_fffffffffffffe28 =
           (ggml_cgraph *)
           ggml_rope_multi(local_48,in_stack_fffffffffffffe30,local_110,0,0x80,&local_128,uVar4,
                           uVar6);
      uVar4 = CONCAT44((int)((ulong)uVar4 >> 0x20),local_dc);
      uVar6 = CONCAT44((int)((ulong)uVar6 >> 0x20),0x8000);
      local_d0 = in_stack_fffffffffffffe28;
      in_stack_fffffffffffffe20 =
           ggml_rope_multi(local_48,local_80,local_118,0,0x80,&local_128,uVar4,uVar6);
      local_d8 = in_stack_fffffffffffffe20;
    }
    uVar3 = ggml_new_graph(local_48);
    ggml_build_forward_expand(uVar3,local_c8);
    ggml_build_forward_expand(uVar3,local_d0);
    ggml_build_forward_expand(uVar3,local_d8);
    ggml_graph_compute_helper
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
               (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
    local_140 = 0.0;
    local_148 = 0.0;
    local_150 = 0.0;
    lVar1 = *(long *)(local_d0 + 0xf8);
    lVar2 = *(long *)(local_d8 + 0xf8);
    in_stack_fffffffffffffe10 =
         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)ggml_nelements(local_d0);
    for (local_168 = 0; local_168 < (int)in_stack_fffffffffffffe10; local_168 = local_168 + 1) {
      local_140 = ABS((double)*(float *)(lVar1 + (long)local_168 * 4)) + local_140;
      local_148 = ABS((double)*(float *)(lVar2 + (long)local_168 * 4)) + local_148;
      local_150 = ABS((double)(*(float *)(lVar1 + (long)local_168 * 4) -
                              *(float *)(lVar2 + (long)local_168 * 4))) + local_150;
    }
    printf("mode: %d\n",(ulong)local_dc);
    printf("sum0: %f\n",local_140);
    printf("sum1: %f\n",local_148);
    printf("diff: %f\n",local_150);
    printf("rel err: %f\n",local_150 / local_140);
    printf("rel err: %f\n",local_150 / local_148);
    if (9.999999747378752e-05 <= local_150 / local_140) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-rope.cpp"
                 ,0xfe,"GGML_ASSERT(%s) failed","diff / sum0 < 0.0001f");
    }
    if (9.999999747378752e-05 <= local_150 / local_148) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-rope.cpp"
                 ,0xff,"GGML_ASSERT(%s) failed","diff / sum1 < 0.0001f");
    }
  }
  ggml_free(local_48);
  local_4 = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_fffffffffffffe10);
  return local_4;
}

Assistant:

int main(int /*argc*/, const char ** /*argv*/) {
    struct ggml_init_params params = {
        /* .mem_size   = */ 128*1024*1024,
        /* .mem_buffer = */ NULL,
        /* .no_alloc   = */ false,
    };

    std::vector<uint8_t> work_buffer;

    struct ggml_context * ctx0 = ggml_init(params);

    struct ggml_tensor * x;

    // rope f32
    for (int m = 0; m < 5; ++m) {
        const int ndims = 4;

        const int64_t n_rot = 128;
        const int64_t ne[4] = { 2*n_rot, 32, 73, 1 };

        const int n_past_0 = 100;
        const int n_past_2 = 33;

        struct ggml_tensor * r0;
        struct ggml_tensor * r1;
        struct ggml_tensor * r2;
        x = get_random_tensor_f32(ctx0, ndims, ne, -1.0f, 1.0f);
        int mode = -1;

        if (m < 3) {
            struct ggml_tensor * p0 = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, ne[2]);
            struct ggml_tensor * p1 = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, ne[2]);
            struct ggml_tensor * p2 = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, ne[2]);

            for (int i = 0; i < ne[2]; ++i) {
                ((int32_t *) p0->data)[i] = n_past_0 + i;
                ((int32_t *) p1->data)[i] = n_past_2 - n_past_0;
                ((int32_t *) p2->data)[i] = n_past_2 + i;
            }
            // test mode 0, 2, 4 (standard, GPT-NeoX, GLM)
            mode = m == 0 ? 0 : m == 1 ? 2 : 4;

            // 100, 101, 102, ..., 172
            r0 = ggml_rope(ctx0, x,  p0, n_rot, mode);
            // -67, -67, -67, ..., -67
            r1 = ggml_rope(ctx0, r0, p1, n_rot, mode); // "context swap", i.e. forget n_past_0 - n_past_2 tokens

            //  33,  34,  35, ..., 105
            r2 = ggml_rope(ctx0, x,  p2, n_rot, mode);
        } else {
            // testing multi-dimension rope position embedding mode
            struct ggml_tensor * p0 = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, ne[2] * 4);
            struct ggml_tensor * p1 = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, ne[2] * 4);
            struct ggml_tensor * p2 = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, ne[2] * 4);

            int sections[4] = {16, 24, 24, 0};
            mode = (m == 3) ? GGML_ROPE_TYPE_MROPE : GGML_ROPE_TYPE_VISION;

            for (int i = 0; i < ne[2]; ++i) {
                for (int j = 0; j < 4; ++j) {
                    ((int32_t *) p0->data)[i + ne[2] * j] = n_past_0 + i + j;
                    ((int32_t *) p1->data)[i + ne[2] * j] = n_past_2 - n_past_0;
                    ((int32_t *) p2->data)[i + ne[2] * j] = n_past_2 + i + j;
                }
            }

            // [[100, 101, 102, ..., 172],
            // [101, 102, 103, ..., 173],
            // [102, 103, 104, ..., 174]]
            r0 = ggml_rope_multi(
                ctx0, x, p0, nullptr,
                n_rot, sections, mode, 32768, 1000000, 1, 0, 1, 32, 1);
            // [[-67, -67, -67, ..., -67]
            // [-67, -67, -67, ..., -67]
            // [-67, -67, -67, ..., -67]]
            r1 = ggml_rope_multi(
                ctx0, r0, p1, nullptr,
                n_rot, sections, mode, 32768, 1000000, 1, 0, 1, 32, 1);

            //  [[33,  34,  35, ..., 105]
            //  [34,  35,  36, ..., 106]
            //  [35,  36,  37, ..., 107]]
            r2 = ggml_rope_multi(
                ctx0, x, p2, nullptr,
                n_rot, sections, mode, 32768, 1000000, 1, 0, 1, 32, 1);
        }

        ggml_cgraph * gf = ggml_new_graph(ctx0);

        ggml_build_forward_expand(gf, r0);
        ggml_build_forward_expand(gf, r1);
        ggml_build_forward_expand(gf, r2);

        ggml_graph_compute_helper(work_buffer, gf, 4);

        // check that r1 and r2 are the same
        {
            double sum0 = 0.0f;
            double sum1 = 0.0f;
            double diff = 0.0f;

            const float * r1_data = (float *) r1->data;
            const float * r2_data = (float *) r2->data;

            const int n_elements = ggml_nelements(r1);

            for (int i = 0; i < n_elements; ++i) {
                sum0 += fabs(r1_data[i]);
                sum1 += fabs(r2_data[i]);
                diff += fabs(r1_data[i] - r2_data[i]);
                //if (fabs(r1_data[i] - r2_data[i]) > 0.0001f) {
                //    printf("%d: %f %f\n", i, r1_data[i], r2_data[i]);
                //    printf("diff: %f\n", fabs(r1_data[i] - r2_data[i]));
                //}
            }

            //for (int i = 4096; i < 4096 + 128; ++i) {
            //    printf("%f %f\n", r1_data[i], r2_data[i]);
            //}

            printf("mode: %d\n", mode);
            printf("sum0: %f\n", sum0);
            printf("sum1: %f\n", sum1);
            printf("diff: %f\n", diff);
            printf("rel err: %f\n", diff / sum0);
            printf("rel err: %f\n", diff / sum1);

            GGML_ASSERT(diff / sum0 < 0.0001f);
            GGML_ASSERT(diff / sum1 < 0.0001f);
        }
    }

    ggml_free(ctx0);

    return 0;
}